

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::TabItemEx(ImGuiTabBar *tab_bar,char *label,bool *p_open,ImGuiTabItemFlags flags)

{
  ImVec2 *pIVar1;
  float fVar2;
  short sVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  ImGuiWindow *pIVar7;
  undefined1 auVar8 [16];
  ImGuiContext *pIVar9;
  bool bVar10;
  bool bVar11;
  ImS8 IVar12;
  ImU32 col;
  ImGuiID close_button_id;
  size_t sVar13;
  undefined8 extraout_RAX;
  char *pcVar14;
  bool *pbVar15;
  ImGuiTabItem *pIVar16;
  byte bVar17;
  ImGuiID IVar18;
  int iVar19;
  uint uVar20;
  ImGuiCol idx;
  bool is_contents_visible;
  float fVar21;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  ImVec2 IVar22;
  bool text_clipped;
  bool just_closed;
  uint local_d0;
  ImGuiID local_cc;
  ImGuiContext *local_c8;
  ImVec2 local_c0;
  uint local_b4;
  bool held;
  float local_ac;
  undefined1 local_a8 [4];
  undefined1 auStack_a4 [12];
  ImDrawList *local_98;
  ImGuiTabItem *local_90;
  bool hovered;
  undefined7 uStack_87;
  float fStack_84;
  ImGuiWindow *local_80;
  uint local_74;
  int local_70;
  int local_6c;
  ImRect bb;
  
  if (tab_bar->WantLayout == true) {
    TabBarLayout(tab_bar);
  }
  pIVar9 = GImGui;
  pIVar7 = GImGui->CurrentWindow;
  if (pIVar7->SkipItems != false) {
    return false;
  }
  local_cc = TabBarCalcTabID(tab_bar,label);
  if ((p_open != (bool *)0x0) && (*p_open == false)) {
    PushItemFlag(0x18,true);
    bb.Min.x = 0.0;
    bb.Min.y = 0.0;
    bb.Max.x = 0.0;
    bb.Max.y = 0.0;
    ItemAdd(&bb,local_cc,(ImRect *)0x0);
    PopItemFlag();
    return false;
  }
  pbVar15 = (bool *)0x0;
  uVar20 = flags;
  if (((uint)flags >> 0x14 & 1) == 0) {
    pbVar15 = p_open;
    uVar20 = flags | 0x100000;
  }
  if (p_open != (bool *)0x0) {
    uVar20 = flags;
  }
  local_80 = pIVar7;
  IVar22 = TabItemCalcSize(label,pbVar15 != (bool *)0x0);
  IVar18 = local_cc;
  auStack_a4._4_4_ = extraout_XMM0_Dc;
  local_a8 = (undefined1  [4])IVar22.x;
  auStack_a4._0_4_ = IVar22.y;
  auStack_a4._8_4_ = extraout_XMM0_Dd;
  local_90 = TabBarFindTabByID(tab_bar,local_cc);
  local_98 = (ImDrawList *)local_90;
  if (local_90 == (ImGuiTabItem *)0x0) {
    bb.Min.x = 0.0;
    bb.Min.y = 0.0;
    bb.Max.x = -NAN;
    bb.Max.y = -NAN;
    ImVector<ImGuiTabItem>::push_back(&tab_bar->Tabs,(ImGuiTabItem *)&bb);
    pIVar16 = (tab_bar->Tabs).Data;
    iVar4 = (tab_bar->Tabs).Size;
    local_90 = pIVar16 + (long)iVar4 + -1;
    local_90->ID = IVar18;
    pIVar16[(long)iVar4 + -1].Width = (float)local_a8;
    tab_bar->TabsAddedNew = true;
  }
  else {
    pIVar16 = (tab_bar->Tabs).Data;
  }
  tab_bar->LastTabItemIdx = (ImS16)(((long)local_90 - (long)pIVar16) / 0x24);
  local_90->ContentWidth = (float)local_a8;
  sVar3 = tab_bar->TabsActiveCount;
  tab_bar->TabsActiveCount = sVar3 + 1;
  local_90->BeginOrder = sVar3;
  local_b4 = tab_bar->Flags;
  local_c0.x = (float)(tab_bar->PrevFrameVisible + 1);
  local_c8 = pIVar9;
  iVar4 = pIVar9->FrameCount;
  iVar19 = local_90->LastFrameVisible + 1;
  local_90->LastFrameVisible = iVar4;
  local_90->Flags = uVar20;
  iVar5 = (tab_bar->TabsNames).Buf.Size;
  sVar3 = (short)iVar5 + -1;
  if (iVar5 == 0) {
    sVar3 = 0;
  }
  local_90->NameOffset = sVar3;
  sVar13 = strlen(label);
  ImGuiTextBuffer::append(&tab_bar->TabsNames,label,label + sVar13 + 1);
  pIVar7 = local_80;
  IVar18 = local_cc;
  bVar17 = iVar19 < iVar4;
  if (((iVar19 < iVar4) && ((tab_bar->Flags & 2) != 0)) && (tab_bar->NextSelectedTabId == 0)) {
    if ((int)local_c0.x < iVar4) {
      if ((uVar20 & 0x200000) == 0 && tab_bar->SelectedTabId == 0) goto LAB_00161241;
    }
    else if ((uVar20 >> 0x15 & 1) == 0) {
LAB_00161241:
      tab_bar->NextSelectedTabId = local_cc;
    }
  }
  if ((((uVar20 & 2) != 0) && (tab_bar->SelectedTabId != local_cc)) && ((uVar20 & 0x200000) == 0)) {
    tab_bar->NextSelectedTabId = local_cc;
  }
  if (tab_bar->VisibleTabId == local_cc) {
    tab_bar->VisibleTabWasSubmitted = true;
    is_contents_visible = true;
  }
  else if ((tab_bar->SelectedTabId == 0 && (int)local_c0.x < iVar4) && ((tab_bar->Tabs).Size == 1))
  {
    is_contents_visible = (tab_bar->Flags & 2) == 0;
  }
  else {
    is_contents_visible = false;
  }
  if ((iVar19 < iVar4) && (local_98 == (ImDrawList *)0x0 || iVar4 <= (int)local_c0.x)) {
    PushItemFlag(0x18,true);
    bb.Min.x = 0.0;
    bb.Min.y = 0.0;
    bb.Max.x = 0.0;
    bb.Max.y = 0.0;
    ItemAdd(&bb,IVar18,(ImRect *)0x0);
    PopItemFlag();
    return (bool)((uVar20 >> 0x15 & 1) == 0 & is_contents_visible);
  }
  if (tab_bar->SelectedTabId == local_cc) {
    local_90->LastFrameSelected = local_c8->FrameCount;
  }
  uVar6 = local_90->Flags;
  fVar2 = local_90->Width;
  fVar21 = local_90->Offset;
  if ((uVar6 & 0xc0) == 0) {
    fVar21 = (float)(int)(fVar21 - tab_bar->ScrollingAnim);
  }
  bb.Min.x = fVar21 + (tab_bar->BarRect).Min.x;
  local_c0 = (local_80->DC).CursorPos;
  bb.Min.y = (tab_bar->BarRect).Min.y + 0.0;
  IVar22.y = bb.Min.y;
  IVar22.x = bb.Min.x;
  (local_80->DC).CursorPos = IVar22;
  bb.Max.x = fVar2 + bb.Min.x;
  bb.Max.y = (float)auStack_a4._0_4_ + bb.Min.y;
  local_d0 = uVar20;
  local_70 = iVar19;
  local_6c = iVar4;
  if ((uVar6 & 0xc0) == 0) {
    fVar2 = tab_bar->ScrollingRectMinX;
    if ((fVar2 <= bb.Min.x) && (bb.Max.x <= tab_bar->ScrollingRectMaxX)) goto LAB_001613a1;
    fStack_84 = bb.Min.y + -1.0;
    _hovered = (float)(~-(uint)(fVar2 <= bb.Min.x) & (uint)fVar2 |
                      (uint)bb.Min.x & -(uint)(fVar2 <= bb.Min.x));
    _held = tab_bar->ScrollingRectMaxX;
    local_ac = bb.Max.y;
    PushClipRect((ImVec2 *)&hovered,(ImVec2 *)&held,true);
    local_a8 = (undefined1  [4])(int)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
  }
  else {
LAB_001613a1:
    auVar8._12_4_ = 0;
    auVar8._0_12_ = auStack_a4;
    _local_a8 = auVar8 << 0x20;
  }
  pIVar9 = local_c8;
  _hovered = bb.Max.x - bb.Min.x;
  fStack_84 = bb.Max.y - bb.Min.y;
  IVar22 = (pIVar7->DC).CursorMaxPos;
  ItemSize((ImVec2 *)&hovered,(local_c8->Style).FramePadding.y);
  (pIVar7->DC).CursorMaxPos = IVar22;
  bVar10 = ItemAdd(&bb,IVar18,(ImRect *)0x0);
  if (!bVar10) {
    if (local_a8[0] != '\0') {
      PopClipRect();
    }
    (local_80->DC).CursorPos = local_c0;
    return is_contents_visible;
  }
  uVar20 = local_d0 & 0x200000;
  bVar10 = ButtonBehavior(&bb,IVar18,&hovered,&held,
                          (uVar20 >> 0x11) + (uint)pIVar9->DragDropActive * 0x200 + 0x1010);
  pIVar7 = local_80;
  if ((bVar10) && (uVar20 == 0)) {
    tab_bar->NextSelectedTabId = IVar18;
  }
  hovered = (bool)(hovered | local_c8->HoveredId == IVar18);
  local_74 = uVar20;
  if (held == false) {
    bVar11 = local_70 < local_6c;
    SetItemAllowOverlap();
    bVar17 = held ^ 1U | bVar11;
    IVar18 = local_cc;
  }
  if (((((bVar17 & 1) == 0) && (bVar11 = IsMouseDragging(0,-1.0), bVar11)) &&
      (local_c8->DragDropActive == false)) && ((tab_bar->Flags & 1) != 0)) {
    fVar2 = (local_c8->IO).MouseDelta.x;
    if (fVar2 < 0.0) {
      IVar12 = -1;
      pIVar1 = &(local_c8->IO).MousePos;
      if (bb.Min.x < pIVar1->x || bb.Min.x == pIVar1->x) goto LAB_001614db;
LAB_001614f6:
      tab_bar->ReorderRequestTabId = local_90->ID;
      tab_bar->ReorderRequestDir = IVar12;
    }
    else {
LAB_001614db:
      if (0.0 < fVar2) {
        IVar12 = '\x01';
        if (bb.Max.x < (local_c8->IO).MousePos.x) goto LAB_001614f6;
      }
    }
  }
  local_98 = pIVar7->DrawList;
  idx = 0x22;
  if ((held == false) && (hovered == false)) {
    if (is_contents_visible == false) {
      idx = (uint)((local_b4 >> 0x15 & 1) == 0) * 3 + 0x21;
    }
    else {
      idx = (uint)((local_b4 >> 0x15 & 1) == 0) * 2 + 0x23;
    }
  }
  col = GetColorU32(idx,1.0);
  TabItemBackground(local_98,&bb,local_d0,col);
  RenderNavHighlight(&bb,IVar18,1);
  bVar11 = IsItemHovered(8);
  if (bVar11) {
    bVar11 = IsMouseClicked(1,false);
    if (bVar11) {
      uVar20 = local_d0 >> 0x15 & 1;
    }
    else {
      bVar11 = IsMouseReleased(1);
      uVar20 = local_74;
      if (!bVar11) goto LAB_00161640;
    }
    if (uVar20 == 0) {
      tab_bar->NextSelectedTabId = IVar18;
    }
  }
LAB_00161640:
  uVar20 = (uint)tab_bar->Flags >> 1 & 4 | local_d0;
  if (pbVar15 == (bool *)0x0) {
    close_button_id = 0;
  }
  else {
    close_button_id = GetIDWithSeed("#CLOSE",(char *)0x0,IVar18);
  }
  TabItemLabelAndCloseButton
            (local_98,&bb,uVar20,tab_bar->FramePadding,label,IVar18,close_button_id,
             is_contents_visible,&just_closed,&text_clipped);
  if ((pbVar15 != (bool *)0x0) && (just_closed != false)) {
    *pbVar15 = false;
    TabBarCloseTab(tab_bar,local_90);
  }
  pIVar9 = local_c8;
  if (local_a8[0] != '\0') {
    PopClipRect();
  }
  uVar20 = local_d0;
  (pIVar7->DC).CursorPos = local_c0;
  if ((((text_clipped == true) && (pIVar9->HoveredId == local_cc)) && (held == false)) &&
     (((0.5 < pIVar9->HoveredIdNotActiveTimer && (bVar11 = IsItemHovered(0), bVar11)) &&
      (((tab_bar->Flags & 0x20) == 0 && ((local_90->Flags & 0x10) == 0)))))) {
    pcVar14 = FindRenderedTextEnd(label,(char *)0x0);
    SetTooltip("%.*s",(ulong)(uint)((int)pcVar14 - (int)label),label);
  }
  if ((uVar20 >> 0x15 & 1) == 0) {
    bVar10 = is_contents_visible;
  }
  return bVar10;
}

Assistant:

bool    ImGui::TabItemEx(ImGuiTabBar* tab_bar, const char* label, bool* p_open, ImGuiTabItemFlags flags)
{
    // Layout whole tab bar if not already done
    if (tab_bar->WantLayout)
        TabBarLayout(tab_bar);

    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = TabBarCalcTabID(tab_bar, label);

    // If the user called us with *p_open == false, we early out and don't render.
    // We make a call to ItemAdd() so that attempts to use a contextual popup menu with an implicit ID won't use an older ID.
    IMGUI_TEST_ENGINE_ITEM_INFO(id, label, window->DC.LastItemStatusFlags);
    if (p_open && !*p_open)
    {
        PushItemFlag(ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus, true);
        ItemAdd(ImRect(), id);
        PopItemFlag();
        return false;
    }

    IM_ASSERT(!p_open || !(flags & ImGuiTabItemFlags_Button));
    IM_ASSERT((flags & (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)) != (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)); // Can't use both Leading and Trailing

    // Store into ImGuiTabItemFlags_NoCloseButton, also honor ImGuiTabItemFlags_NoCloseButton passed by user (although not documented)
    if (flags & ImGuiTabItemFlags_NoCloseButton)
        p_open = NULL;
    else if (p_open == NULL)
        flags |= ImGuiTabItemFlags_NoCloseButton;

    // Calculate tab contents size
    ImVec2 size = TabItemCalcSize(label, p_open != NULL);

    // Acquire tab data
    ImGuiTabItem* tab = TabBarFindTabByID(tab_bar, id);
    bool tab_is_new = false;
    if (tab == NULL)
    {
        tab_bar->Tabs.push_back(ImGuiTabItem());
        tab = &tab_bar->Tabs.back();
        tab->ID = id;
        tab->Width = size.x;
        tab_bar->TabsAddedNew = true;
        tab_is_new = true;
    }
    tab_bar->LastTabItemIdx = (ImS16)tab_bar->Tabs.index_from_ptr(tab);
    tab->ContentWidth = size.x;
    tab->BeginOrder = tab_bar->TabsActiveCount++;

    const bool tab_bar_appearing = (tab_bar->PrevFrameVisible + 1 < g.FrameCount);
    const bool tab_bar_focused = (tab_bar->Flags & ImGuiTabBarFlags_IsFocused) != 0;
    const bool tab_appearing = (tab->LastFrameVisible + 1 < g.FrameCount);
    const bool is_tab_button = (flags & ImGuiTabItemFlags_Button) != 0;
    tab->LastFrameVisible = g.FrameCount;
    tab->Flags = flags;

    // Append name with zero-terminator
    tab->NameOffset = (ImS16)tab_bar->TabsNames.size();
    tab_bar->TabsNames.append(label, label + strlen(label) + 1);

    // Update selected tab
    if (tab_appearing && (tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs) && tab_bar->NextSelectedTabId == 0)
        if (!tab_bar_appearing || tab_bar->SelectedTabId == 0)
            if (!is_tab_button)
                tab_bar->NextSelectedTabId = id;  // New tabs gets activated
    if ((flags & ImGuiTabItemFlags_SetSelected) && (tab_bar->SelectedTabId != id)) // SetSelected can only be passed on explicit tab bar
        if (!is_tab_button)
            tab_bar->NextSelectedTabId = id;

    // Lock visibility
    // (Note: tab_contents_visible != tab_selected... because CTRL+TAB operations may preview some tabs without selecting them!)
    bool tab_contents_visible = (tab_bar->VisibleTabId == id);
    if (tab_contents_visible)
        tab_bar->VisibleTabWasSubmitted = true;

    // On the very first frame of a tab bar we let first tab contents be visible to minimize appearing glitches
    if (!tab_contents_visible && tab_bar->SelectedTabId == 0 && tab_bar_appearing)
        if (tab_bar->Tabs.Size == 1 && !(tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs))
            tab_contents_visible = true;

    // Note that tab_is_new is not necessarily the same as tab_appearing! When a tab bar stops being submitted
    // and then gets submitted again, the tabs will have 'tab_appearing=true' but 'tab_is_new=false'.
    if (tab_appearing && (!tab_bar_appearing || tab_is_new))
    {
        PushItemFlag(ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus, true);
        ItemAdd(ImRect(), id);
        PopItemFlag();
        if (is_tab_button)
            return false;
        return tab_contents_visible;
    }

    if (tab_bar->SelectedTabId == id)
        tab->LastFrameSelected = g.FrameCount;

    // Backup current layout position
    const ImVec2 backup_main_cursor_pos = window->DC.CursorPos;

    // Layout
    const bool is_central_section = (tab->Flags & (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)) == 0;
    size.x = tab->Width;
    if (is_central_section)
        window->DC.CursorPos = tab_bar->BarRect.Min + ImVec2(IM_FLOOR(tab->Offset - tab_bar->ScrollingAnim), 0.0f);
    else
        window->DC.CursorPos = tab_bar->BarRect.Min + ImVec2(tab->Offset, 0.0f);
    ImVec2 pos = window->DC.CursorPos;
    ImRect bb(pos, pos + size);

    // We don't have CPU clipping primitives to clip the CloseButton (until it becomes a texture), so need to add an extra draw call (temporary in the case of vertical animation)
    const bool want_clip_rect = is_central_section && (bb.Min.x < tab_bar->ScrollingRectMinX || bb.Max.x > tab_bar->ScrollingRectMaxX);
    if (want_clip_rect)
        PushClipRect(ImVec2(ImMax(bb.Min.x, tab_bar->ScrollingRectMinX), bb.Min.y - 1), ImVec2(tab_bar->ScrollingRectMaxX, bb.Max.y), true);

    ImVec2 backup_cursor_max_pos = window->DC.CursorMaxPos;
    ItemSize(bb.GetSize(), style.FramePadding.y);
    window->DC.CursorMaxPos = backup_cursor_max_pos;

    if (!ItemAdd(bb, id))
    {
        if (want_clip_rect)
            PopClipRect();
        window->DC.CursorPos = backup_main_cursor_pos;
        return tab_contents_visible;
    }

    // Click to Select a tab
    ImGuiButtonFlags button_flags = ((is_tab_button ? ImGuiButtonFlags_PressedOnClickRelease : ImGuiButtonFlags_PressedOnClick) | ImGuiButtonFlags_AllowItemOverlap);
    if (g.DragDropActive)
        button_flags |= ImGuiButtonFlags_PressedOnDragDropHold;
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, button_flags);
    if (pressed && !is_tab_button)
        tab_bar->NextSelectedTabId = id;
    hovered |= (g.HoveredId == id);

    // Allow the close button to overlap unless we are dragging (in which case we don't want any overlapping tabs to be hovered)
    if (!held)
        SetItemAllowOverlap();

    // Drag and drop: re-order tabs
    if (held && !tab_appearing && IsMouseDragging(0))
    {
        if (!g.DragDropActive && (tab_bar->Flags & ImGuiTabBarFlags_Reorderable))
        {
            // While moving a tab it will jump on the other side of the mouse, so we also test for MouseDelta.x
            if (g.IO.MouseDelta.x < 0.0f && g.IO.MousePos.x < bb.Min.x)
            {
                if (tab_bar->Flags & ImGuiTabBarFlags_Reorderable)
                    TabBarQueueReorder(tab_bar, tab, -1);
            }
            else if (g.IO.MouseDelta.x > 0.0f && g.IO.MousePos.x > bb.Max.x)
            {
                if (tab_bar->Flags & ImGuiTabBarFlags_Reorderable)
                    TabBarQueueReorder(tab_bar, tab, +1);
            }
        }
    }

#if 0
    if (hovered && g.HoveredIdNotActiveTimer > 0.50f && bb.GetWidth() < tab->ContentWidth)
    {
        // Enlarge tab display when hovering
        bb.Max.x = bb.Min.x + IM_FLOOR(ImLerp(bb.GetWidth(), tab->ContentWidth, ImSaturate((g.HoveredIdNotActiveTimer - 0.40f) * 6.0f)));
        display_draw_list = GetForegroundDrawList(window);
        TabItemBackground(display_draw_list, bb, flags, GetColorU32(ImGuiCol_TitleBgActive));
    }
#endif

    // Render tab shape
    ImDrawList* display_draw_list = window->DrawList;
    const ImU32 tab_col = GetColorU32((held || hovered) ? ImGuiCol_TabHovered : tab_contents_visible ? (tab_bar_focused ? ImGuiCol_TabActive : ImGuiCol_TabUnfocusedActive) : (tab_bar_focused ? ImGuiCol_Tab : ImGuiCol_TabUnfocused));
    TabItemBackground(display_draw_list, bb, flags, tab_col);
    RenderNavHighlight(bb, id);

    // Select with right mouse button. This is so the common idiom for context menu automatically highlight the current widget.
    const bool hovered_unblocked = IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByPopup);
    if (hovered_unblocked && (IsMouseClicked(1) || IsMouseReleased(1)))
        if (!is_tab_button)
            tab_bar->NextSelectedTabId = id;

    if (tab_bar->Flags & ImGuiTabBarFlags_NoCloseWithMiddleMouseButton)
        flags |= ImGuiTabItemFlags_NoCloseWithMiddleMouseButton;

    // Render tab label, process close button
    const ImGuiID close_button_id = p_open ? GetIDWithSeed("#CLOSE", NULL, id) : 0;
    bool just_closed;
    bool text_clipped;
    TabItemLabelAndCloseButton(display_draw_list, bb, flags, tab_bar->FramePadding, label, id, close_button_id, tab_contents_visible, &just_closed, &text_clipped);
    if (just_closed && p_open != NULL)
    {
        *p_open = false;
        TabBarCloseTab(tab_bar, tab);
    }

    // Restore main window position so user can draw there
    if (want_clip_rect)
        PopClipRect();
    window->DC.CursorPos = backup_main_cursor_pos;

    // Tooltip (FIXME: Won't work over the close button because ItemOverlap systems messes up with HoveredIdTimer)
    // We test IsItemHovered() to discard e.g. when another item is active or drag and drop over the tab bar (which g.HoveredId ignores)
    if (text_clipped && g.HoveredId == id && !held && g.HoveredIdNotActiveTimer > 0.50f && IsItemHovered())
        if (!(tab_bar->Flags & ImGuiTabBarFlags_NoTooltip) && !(tab->Flags & ImGuiTabItemFlags_NoTooltip))
            SetTooltip("%.*s", (int)(FindRenderedTextEnd(label) - label), label);

    IM_ASSERT(!is_tab_button || !(tab_bar->SelectedTabId == tab->ID && is_tab_button)); // TabItemButton should not be selected
    if (is_tab_button)
        return pressed;
    return tab_contents_visible;
}